

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSplit.c
# Opt level: O2

int Cec_GiaSplitTest(Gia_Man_t *p,int nProcs,int nTimeOut,int nIterMax,int LookAhead,int fVerbose,
                    int fVeryVerbose,int fSilent)

{
  uint iOutStop;
  byte bVar1;
  int iVar2;
  uint uVar3;
  Gia_Obj_t *pGVar4;
  Gia_Man_t *p_00;
  int local_58;
  Abc_Cex_t *local_40;
  
  Abc_CexFreeP(&p->pCexComb);
  local_58 = -1;
  local_40 = (Abc_Cex_t *)0x0;
  bVar1 = 0;
  uVar3 = 0;
  while ((int)uVar3 < p->vCos->nSize - p->nRegs) {
    iVar2 = Vec_IntEntry(p->vCos,uVar3);
    pGVar4 = Gia_ManObj(p,iVar2);
    if (pGVar4 == (Gia_Obj_t *)0x0) break;
    iOutStop = uVar3 + 1;
    p_00 = Gia_ManDupOutputGroup(p,uVar3,iOutStop);
    if (fVerbose != 0) {
      printf("\nSolving output %d:\n",(ulong)uVar3);
    }
    iVar2 = Cec_GiaSplitTestInt(p_00,nProcs,nTimeOut,nIterMax,LookAhead,fVerbose,fVeryVerbose,
                                fSilent);
    Gia_ManStop(p_00);
    if (local_58 == -1 && iVar2 == 0) {
      local_40 = p_00->pCexComb;
      p_00->pCexComb = (Abc_Cex_t *)0x0;
      local_40->iPo = uVar3;
      local_58 = 0;
    }
    uVar3 = iOutStop;
    if (iVar2 == -1) {
      bVar1 = 1;
    }
  }
  if (local_58 == -1) {
    uVar3 = -(uint)bVar1 | 1;
  }
  else {
    p->pCexComb = local_40;
    uVar3 = 0;
  }
  return uVar3;
}

Assistant:

int Cec_GiaSplitTest( Gia_Man_t * p, int nProcs, int nTimeOut, int nIterMax, int LookAhead, int fVerbose, int fVeryVerbose, int fSilent )
{
    Abc_Cex_t * pCex = NULL;
    Gia_Man_t * pOne;
    Gia_Obj_t * pObj;
    int i, RetValue1, fOneUndef = 0, RetValue = -1;
    Abc_CexFreeP( &p->pCexComb );
    Gia_ManForEachPo( p, pObj, i )
    {
        pOne = Gia_ManDupOutputGroup( p, i, i+1 );
        if ( fVerbose )
            printf( "\nSolving output %d:\n", i );
        RetValue1 = Cec_GiaSplitTestInt( pOne, nProcs, nTimeOut, nIterMax, LookAhead,  fVerbose, fVeryVerbose, fSilent );
        Gia_ManStop( pOne );
        // collect the result
        if ( RetValue1 == 0 && RetValue == -1 )
        {
            pCex = pOne->pCexComb; pOne->pCexComb = NULL;
            pCex->iPo = i;
            RetValue = 0;
        }
        if ( RetValue1 == -1 )
            fOneUndef = 1;
    }
    if ( RetValue == -1 )
        RetValue = fOneUndef ? -1 : 1;
    else
        p->pCexComb = pCex;
    return RetValue;
}